

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O3

bool xercesc_4_0::XMLChar1_0::containsWhiteSpace(XMLCh *toCheck,XMLSize_t count)

{
  XMLCh *pXVar1;
  XMLCh XVar2;
  bool bVar3;
  
  if (count == 0) {
    return false;
  }
  pXVar1 = toCheck + count;
  do {
    bVar3 = toCheck < pXVar1;
    if (!bVar3) {
      return bVar3;
    }
    XVar2 = *toCheck;
    toCheck = toCheck + 1;
  } while (-1 < (char)(&fgCharCharsTable1_0)[(ushort)XVar2]);
  return bVar3;
}

Assistant:

bool XMLChar1_0::containsWhiteSpace(const   XMLCh* const    toCheck
                                   , const XMLSize_t        count)
{
    if (count == 0)
        return false;

    const XMLCh* curCh = toCheck;
    const XMLCh* endPtr = toCheck + count;
    while (curCh < endPtr)
    {
        if (fgCharCharsTable1_0[*curCh++] & gWhitespaceCharMask)
            return true;
    }
    return false;
}